

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_file.c
# Opt level: O3

off_t qc_file_tell(QcFile *file)

{
  int iVar1;
  off_t oVar2;
  stat sStack_a0;
  
  if (file != (QcFile *)0x0) {
    oVar2 = lseek(file->filedes,0,1);
    if (oVar2 < 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0xa5,"file tell failed");
      oVar2 = -1;
    }
    return oVar2;
  }
  qc_file_tell_cold_1();
  if (file != (QcFile *)0x0) {
    sStack_a0.__unused[2] = 0x108b9d;
    iVar1 = access((char *)file,0);
    return (ulong)-(uint)(iVar1 != 0);
  }
  sStack_a0.__unused[2] = (long)qc_file_size;
  qc_file_exist_cold_1();
  iVar1 = stat((char *)file,&sStack_a0);
  oVar2 = -1;
  if (-1 < iVar1) {
    oVar2 = sStack_a0.st_size;
  }
  return oVar2;
}

Assistant:

off_t qc_file_tell(QcFile *file)
{
    off_t off;

    qc_assert(file);

    off = lseek(file->filedes, 0, SEEK_CUR);
    if(off < 0)
    {
        qc_error("file tell failed");
        return -1;
    }

    return off;
}